

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void aarch64_sync_32_to_64_arm(CPUARMState *env)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint uVar8;
  long lVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  
  uVar8 = env->uncached_cpsr;
  lVar9 = 8;
  do {
    *(ulong *)(env->regs + lVar9 * 2) = (ulong)env->regs[lVar9 + -8];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  uVar8 = uVar8 & 0x1f;
  if (uVar8 == 0x11) {
    lVar9 = 0;
    do {
      env->xregs[lVar9 + 8] = (ulong)env->usr_regs[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
  }
  else {
    lVar9 = 0x10;
    do {
      *(ulong *)(env->regs + lVar9 * 2) = (ulong)env->regs[lVar9 + -8];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x15);
  }
  if ((uVar8 == 0x1f) || (uVar8 == 0x10)) {
    uVar3 = env->regs[0xe];
    env->xregs[0xd] = (ulong)env->regs[0xd];
    env->xregs[0xe] = (ulong)uVar3;
  }
  else {
    env->xregs[0xd] = (ulong)env->banked_r13[0];
    if (uVar8 == 0x1a) {
      uVar3 = env->regs[0xe];
    }
    else {
      uVar3 = env->banked_r14[0];
    }
    env->xregs[0xe] = (ulong)uVar3;
  }
  puVar1 = env->regs + 0xd;
  puVar10 = env->banked_r13 + 6;
  if (uVar8 == 0x1a) {
    puVar10 = puVar1;
  }
  puVar2 = env->regs + 0xe;
  puVar11 = env->banked_r13 + 4;
  puVar4 = env->banked_r14 + 4;
  if (uVar8 == 0x12) {
    puVar11 = puVar1;
    puVar4 = puVar2;
  }
  puVar13 = env->banked_r13 + 1;
  puVar5 = env->banked_r14 + 1;
  if (uVar8 == 0x13) {
    puVar13 = puVar1;
    puVar5 = puVar2;
  }
  puVar14 = env->banked_r13 + 2;
  puVar6 = env->banked_r14 + 2;
  if (uVar8 == 0x17) {
    puVar14 = puVar1;
    puVar6 = puVar2;
  }
  puVar12 = env->banked_r13 + 3;
  puVar7 = env->banked_r14 + 3;
  if (uVar8 == 0x1b) {
    puVar12 = puVar1;
    puVar7 = puVar2;
  }
  env->xregs[0xf] = (ulong)*puVar10;
  env->xregs[0x10] = (ulong)*puVar4;
  env->xregs[0x11] = (ulong)*puVar11;
  env->xregs[0x12] = (ulong)*puVar5;
  env->xregs[0x13] = (ulong)*puVar13;
  env->xregs[0x14] = (ulong)*puVar6;
  env->xregs[0x15] = (ulong)*puVar14;
  env->xregs[0x16] = (ulong)*puVar7;
  env->xregs[0x17] = (ulong)*puVar12;
  if (uVar8 == 0x11) {
    lVar9 = 0;
    do {
      env->banked_spsr[lVar9 + -0xc] = (ulong)env->regs[lVar9 + 8];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 7);
  }
  else {
    lVar9 = 0;
    do {
      env->banked_spsr[lVar9 + -0xc] = (ulong)env->fiq_regs[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    uVar8 = env->banked_r14[5];
    env->xregs[0x1d] = (ulong)env->banked_r13[5];
    env->xregs[0x1e] = (ulong)uVar8;
  }
  env->pc = (ulong)env->regs[0xf];
  return;
}

Assistant:

void aarch64_sync_32_to_64(CPUARMState *env)
{
    int i;
    uint32_t mode = env->uncached_cpsr & CPSR_M;

    /* We can blanket copy R[0:7] to X[0:7] */
    for (i = 0; i < 8; i++) {
        env->xregs[i] = env->regs[i];
    }

    /*
     * Unless we are in FIQ mode, x8-x12 come from the user registers r8-r12.
     * Otherwise, they come from the banked user regs.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->usr_regs[i - 8];
        }
    } else {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->regs[i];
        }
    }

    /*
     * Registers x13-x23 are the various mode SP and FP registers. Registers
     * r13 and r14 are only copied if we are in that mode, otherwise we copy
     * from the mode banked register.
     */
    if (mode == ARM_CPU_MODE_USR || mode == ARM_CPU_MODE_SYS) {
        env->xregs[13] = env->regs[13];
        env->xregs[14] = env->regs[14];
    } else {
        env->xregs[13] = env->banked_r13[bank_number(ARM_CPU_MODE_USR)];
        /* HYP is an exception in that it is copied from r14 */
        if (mode == ARM_CPU_MODE_HYP) {
            env->xregs[14] = env->regs[14];
        } else {
            env->xregs[14] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_USR)];
        }
    }

    if (mode == ARM_CPU_MODE_HYP) {
        env->xregs[15] = env->regs[13];
    } else {
        env->xregs[15] = env->banked_r13[bank_number(ARM_CPU_MODE_HYP)];
    }

    if (mode == ARM_CPU_MODE_IRQ) {
        env->xregs[16] = env->regs[14];
        env->xregs[17] = env->regs[13];
    } else {
        env->xregs[16] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_IRQ)];
        env->xregs[17] = env->banked_r13[bank_number(ARM_CPU_MODE_IRQ)];
    }

    if (mode == ARM_CPU_MODE_SVC) {
        env->xregs[18] = env->regs[14];
        env->xregs[19] = env->regs[13];
    } else {
        env->xregs[18] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_SVC)];
        env->xregs[19] = env->banked_r13[bank_number(ARM_CPU_MODE_SVC)];
    }

    if (mode == ARM_CPU_MODE_ABT) {
        env->xregs[20] = env->regs[14];
        env->xregs[21] = env->regs[13];
    } else {
        env->xregs[20] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_ABT)];
        env->xregs[21] = env->banked_r13[bank_number(ARM_CPU_MODE_ABT)];
    }

    if (mode == ARM_CPU_MODE_UND) {
        env->xregs[22] = env->regs[14];
        env->xregs[23] = env->regs[13];
    } else {
        env->xregs[22] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_UND)];
        env->xregs[23] = env->banked_r13[bank_number(ARM_CPU_MODE_UND)];
    }

    /*
     * Registers x24-x30 are mapped to r8-r14 in FIQ mode.  If we are in FIQ
     * mode, then we can copy from r8-r14.  Otherwise, we copy from the
     * FIQ bank for r8-r14.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 24; i < 31; i++) {
            env->xregs[i] = env->regs[i - 16];   /* X[24:30] <- R[8:14] */
        }
    } else {
        for (i = 24; i < 29; i++) {
            env->xregs[i] = env->fiq_regs[i - 24];
        }
        env->xregs[29] = env->banked_r13[bank_number(ARM_CPU_MODE_FIQ)];
        env->xregs[30] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_FIQ)];
    }

    env->pc = env->regs[15];
}